

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O0

void __thiscall
wabt::Decompiler::Decompiler(Decompiler *this,Module *module,DecompileOptions *options)

{
  DecompileOptions *options_local;
  Module *module_local;
  Decompiler *this_local;
  
  ModuleContext::ModuleContext(&this->mc,module);
  this->options = options;
  this->indent_amount = 2;
  this->target_exp_width = 0x46;
  this->cur_func = (Func *)0x0;
  this->cur_ast = (AST *)0x0;
  LoadStoreTracking::LoadStoreTracking(&this->lst);
  return;
}

Assistant:

Decompiler(const Module& module, const DecompileOptions& options)
      : mc(module), options(options) {}